

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIterationDynamicSlices(void)

{
  initializer_list<int> __l;
  bool bVar1;
  size_t sVar2;
  iterator ptVar3;
  ostream *poVar4;
  Span<const_int,_18446744073709551615UL> SVar5;
  SliceIterator SVar6;
  int i;
  iterator __end2;
  iterator __begin2;
  Span<const_int,_18446744073709551615UL> *__range2;
  undefined1 local_e0 [8];
  Span<const_int,_18446744073709551615UL> row;
  SliceIterator __end1;
  SliceIterator __begin1;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *__range1;
  undefined1 auStack_80 [4];
  int counter;
  Span<const_int,_18446744073709551615UL> span;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_58[5] = 6;
  local_38 = local_58;
  local_30 = 6;
  std::allocator<int>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_59);
  std::allocator<int>::~allocator(&local_59);
  SVar5 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar5.m_size.m_size;
  _auStack_80 = SVar5.m_ptr;
  __range1._4_4_ = 0;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices
            ((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
              *)&__begin1.m_stride,(Span<const_int,_18446744073709551615UL> *)auStack_80,3);
  SVar6 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
          IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>::
          begin((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
                 *)&__begin1.m_stride);
  __begin1.m_ptr = (pointer)SVar6.m_stride;
  __end1.m_stride = (size_t)SVar6.m_ptr;
  SVar6 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::
          IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>::
          end((IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
               *)&__begin1.m_stride);
  do {
    __end1.m_ptr = (pointer)SVar6.m_stride;
    row.m_size.m_size = (size_t)SVar6.m_ptr;
    bVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator!=
                      ((SliceIterator *)&__end1.m_stride,(SliceIterator *)&row.m_size);
    if (!bVar1) {
      if (__range1._4_4_ == 6) {
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x267);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(counter) == (6)");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
      }
LAB_001c6695:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28)
      ;
      return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
    }
    SVar5 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator*
                      ((SliceIterator *)&__end1.m_stride);
    row.m_ptr = (pointer)SVar5.m_size.m_size;
    local_e0 = (undefined1  [8])SVar5.m_ptr;
    sVar2 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::Size
                      ((Span<const_int,_18446744073709551615UL> *)local_e0);
    if (sVar2 != 3) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x261);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(row.Size()) == (size_t(3))");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      goto LAB_001c6695;
    }
    __end2 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::begin
                       ((Span<const_int,_18446744073709551615UL> *)local_e0);
    ptVar3 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::end
                       ((Span<const_int,_18446744073709551615UL> *)local_e0);
    for (; __end2 != ptVar3; __end2 = __end2 + 1) {
      __range1._4_4_ = __range1._4_4_ + 1;
      if (*__end2 != __range1._4_4_) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x264);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(i) == (++counter)");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 1;
        goto LAB_001c6695;
      }
    }
    MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator::operator++
              ((SliceIterator *)&__end1.m_stride);
    SVar6.m_stride = (size_t)__end1.m_ptr;
    SVar6.m_ptr = (pointer)row.m_size.m_size;
  } while( true );
}

Assistant:

int testSpanTestsIterationDynamicSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices(3)) {
        ML_ASSERT_EQ(row.Size(), size_t(3));

        for (auto i : row) {
            ML_ASSERT_EQ(i, ++counter);
        }
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}